

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O0

Data * Data::display(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  Data *data;
  bool bVar1;
  reference ppDVar2;
  Data *i;
  iterator __end1;
  iterator __begin1;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  vector<Data_*,_std::allocator<Data_*>_> *dataPara_local;
  
  __end1 = std::vector<Data_*,_std::allocator<Data_*>_>::begin(dataPara);
  i = (Data *)std::vector<Data_*,_std::allocator<Data_*>_>::end(dataPara);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppDVar2 = __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::
              operator*(&__end1);
    data = *ppDVar2;
    (*data->_vptr_Data[3])();
    check(data);
    __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::operator++
              (&__end1);
  }
  if (dataPara != (vector<Data_*,_std::allocator<Data_*>_> *)0x0) {
    std::vector<Data_*,_std::allocator<Data_*>_>::~vector(dataPara);
    operator_delete(dataPara);
  }
  return trueData;
}

Assistant:

Data *Data::display(std::vector<Data *> *dataPara) {
    for (auto i: *dataPara) {
        i->display();
        Data::check(i);
    }
    delete dataPara;
    return Data::trueData;
}